

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

QByteArray * __thiscall QBufferPrivate::peek(QBufferPrivate *this,qint64 maxSize)

{
  qsizetype qVar1;
  longlong *plVar2;
  QByteArray *in_RDX;
  char *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qint64 readBytes;
  QByteArray *in_stack_ffffffffffffffa8;
  longlong size;
  char *data;
  QByteArray *this_00;
  long local_18;
  QByteArray *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RSI;
  this_00 = in_RDI;
  local_10 = in_RDX;
  qVar1 = QByteArray::size(*(QByteArray **)(in_RSI + 0x188));
  local_18 = qVar1 - *(long *)(in_RSI + 0x78);
  plVar2 = qMin<long_long>((longlong *)&local_10,&local_18);
  size = *plVar2;
  if (*(long *)(in_RSI + 0x78) == 0) {
    qVar1 = QByteArray::size(*(QByteArray **)(in_RSI + 0x188));
    if (qVar1 <= (long)local_10) {
      QByteArray::QByteArray(local_10,in_stack_ffffffffffffffa8);
      goto LAB_00273908;
    }
  }
  QByteArray::constData((QByteArray *)0x2738ed);
  QByteArray::QByteArray(this_00,data,size);
LAB_00273908:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QBufferPrivate::peek(qint64 maxSize)
{
    qint64 readBytes = qMin(maxSize, static_cast<qint64>(buf->size()) - pos);
    if (pos == 0 && maxSize >= buf->size())
        return *buf;
    return QByteArray(buf->constData() + pos, readBytes);
}